

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (bootstrap_analysis *__return_storage_ptr__,double confidence_level,int n_resamples,
          iterator first,iterator last)

{
  double dVar1;
  Estimate<double> mean;
  Estimate<double> stddev;
  int iVar2;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  Estimate<double> local_90;
  Estimate<double> local_70;
  anon_class_32_4_6f2d8bc5 local_50;
  
  if (analyse_samples(double,int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
      ::entropy == '\0') {
    iVar2 = __cxa_guard_acquire(&analyse_samples(double,int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                                 ::entropy);
    if (iVar2 != 0) {
      clara::std::random_device::random_device(&analyse_samples::entropy);
      __cxa_atexit(clara::std::random_device::~random_device,&analyse_samples::entropy,&__dso_handle
                  );
      __cxa_guard_release(&analyse_samples(double,int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                           ::entropy);
    }
  }
  local_50.n_resamples = n_resamples;
  local_50.first._M_current = first._M_current;
  local_50.last._M_current = last._M_current;
  local_50.confidence_level = confidence_level;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            (&local_70,&local_50,
             mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>)
  ;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            (&local_90,&local_50,anon_unknown.dwarf_4c7486::standard_deviation);
  mean.lower_bound = local_70.lower_bound;
  mean.point = local_70.point;
  mean.upper_bound = local_70.upper_bound;
  mean.confidence_interval = local_70.confidence_interval;
  stddev.lower_bound = local_90.lower_bound;
  stddev.point = local_90.point;
  stddev.upper_bound = local_90.upper_bound;
  stddev.confidence_interval = local_90.confidence_interval;
  dVar1 = outlier_variance(mean,stddev,
                           (int)((ulong)((long)last._M_current - (long)first._M_current) >> 3));
  (__return_storage_ptr__->mean).point = local_70.point;
  (__return_storage_ptr__->mean).lower_bound = local_70.lower_bound;
  (__return_storage_ptr__->mean).upper_bound = local_70.upper_bound;
  (__return_storage_ptr__->mean).confidence_interval = local_70.confidence_interval;
  (__return_storage_ptr__->standard_deviation).point = local_90.point;
  (__return_storage_ptr__->standard_deviation).lower_bound = local_90.lower_bound;
  (__return_storage_ptr__->standard_deviation).upper_bound = local_90.upper_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval = local_90.confidence_interval;
  __return_storage_ptr__->outlier_variance = dVar1;
  return __return_storage_ptr__;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level, int n_resamples, std::vector<double>::iterator first, std::vector<double>::iterator last) {
                CATCH_INTERNAL_START_WARNINGS_SUPPRESSION
                CATCH_INTERNAL_SUPPRESS_GLOBALS_WARNINGS
                static std::random_device entropy;
                CATCH_INTERNAL_STOP_WARNINGS_SUPPRESSION

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++

                auto mean = &Detail::mean<std::vector<double>::iterator>;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(std::vector<double>::iterator, std::vector<double>::iterator)) {
                    auto seed = entropy();
                    return std::async(std::launch::async, [=] {
                        std::mt19937 rng(seed);
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(std::vector<double>::iterator, std::vector<double>::iterator)) {
                    auto seed = entropy();
                    std::mt19937 rng(seed);
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }